

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void __thiscall
Json::BuiltStyledStreamWriter::BuiltStyledStreamWriter
          (BuiltStyledStreamWriter *this,string *indentation,Enum cs,string *colonSymbol,
          string *nullSymbol,string *endingLineFeedSymbol)

{
  pointer pcVar1;
  
  (this->super_StreamWriter).sout_ = (ostream *)0x0;
  (this->super_StreamWriter)._vptr_StreamWriter =
       (_func_int **)&PTR__BuiltStyledStreamWriter_00139c28;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->childValues_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indentString_)._M_dataplus._M_p = (pointer)&(this->indentString_).field_2;
  (this->indentString_)._M_string_length = 0;
  (this->indentString_).field_2._M_local_buf[0] = '\0';
  this->rightMargin_ = 0x4a;
  (this->indentation_)._M_dataplus._M_p = (pointer)&(this->indentation_).field_2;
  pcVar1 = (indentation->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->indentation_,pcVar1,pcVar1 + indentation->_M_string_length);
  this->cs_ = cs;
  (this->colonSymbol_)._M_dataplus._M_p = (pointer)&(this->colonSymbol_).field_2;
  pcVar1 = (colonSymbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->colonSymbol_,pcVar1,pcVar1 + colonSymbol->_M_string_length);
  (this->nullSymbol_)._M_dataplus._M_p = (pointer)&(this->nullSymbol_).field_2;
  pcVar1 = (nullSymbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->nullSymbol_,pcVar1,pcVar1 + nullSymbol->_M_string_length);
  (this->endingLineFeedSymbol_)._M_dataplus._M_p = (pointer)&(this->endingLineFeedSymbol_).field_2;
  pcVar1 = (endingLineFeedSymbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->endingLineFeedSymbol_,pcVar1,
             pcVar1 + endingLineFeedSymbol->_M_string_length);
  this->field_0xd8 = this->field_0xd8 & 0xfc;
  return;
}

Assistant:

BuiltStyledStreamWriter::BuiltStyledStreamWriter(
      std::string const& indentation,
      CommentStyle::Enum cs,
      std::string const& colonSymbol,
      std::string const& nullSymbol,
      std::string const& endingLineFeedSymbol)
  : rightMargin_(74)
  , indentation_(indentation)
  , cs_(cs)
  , colonSymbol_(colonSymbol)
  , nullSymbol_(nullSymbol)
  , endingLineFeedSymbol_(endingLineFeedSymbol)
  , addChildValues_(false)
  , indented_(false)
{
}